

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::shallowCopy(QPDFObjectHandle *this)

{
  bool bVar1;
  logic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr *in_RSI;
  QPDFObjectHandle QVar2;
  BaseHandle local_38 [2];
  QPDFObjectHandle *this_local;
  
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"operation attempted on uninitialized QPDFObjectHandle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  ::qpdf::BaseHandle::copy(local_38,(EVP_PKEY_CTX *)in_RSI,(EVP_PKEY_CTX *)0x0);
  QPDFObjectHandle(this,&local_38[0].obj);
  std::shared_ptr<QPDFObject>::~shared_ptr(&local_38[0].obj);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::shallowCopy()
{
    if (!obj) {
        throw std::logic_error("operation attempted on uninitialized QPDFObjectHandle");
    }
    return {copy()};
}